

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O2

void Cec_GiaSplitPrintRefs(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Obj_t *pObj;
  int v;
  
  if (p->pRefs == (int *)0x0) {
    Gia_ManCreateRefs(p);
  }
  for (v = 0; v < p->vCis->nSize - p->nRegs; v = v + 1) {
    pObj = Gia_ManCi(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ObjRefNum(p,pObj);
    printf("%d ",(ulong)uVar1);
  }
  putchar(10);
  return;
}

Assistant:

void Cec_GiaSplitPrintRefs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    if ( p->pRefs == NULL )
        Gia_ManCreateRefs( p ); 
    Gia_ManForEachPi( p, pObj, i )
        printf( "%d ", Gia_ObjRefNum(p, pObj) );
    printf( "\n" );
}